

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O3

void flatbuffers::(anonymous_namespace)::
     SimpleQsort<flatbuffers::Offset<flatbuffers::Table>,flatbuffers::Parser::ParseVector(flatbuffers::Type_const&,unsigned_int*,flatbuffers::FieldDef*,unsigned_long)::__3,void(*)(flatbuffers::Offset<flatbuffers::Table>*,flatbuffers::Offset<flatbuffers::Table>*)>
               (Offset<flatbuffers::Table> *begin,Offset<flatbuffers::Table> *end,size_t width,
               anon_class_8_1_ba1d59bf comparator,
               _func_void_Offset<flatbuffers::Table>_ptr_Offset<flatbuffers::Table>_ptr *swapper)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  bool bVar7;
  int iVar8;
  uint *puVar9;
  ulong uVar10;
  ushort *puVar11;
  int *piVar12;
  uint *puVar13;
  Offset<flatbuffers::Table> *b;
  Offset<flatbuffers::Table> *a;
  
  lVar5 = -(long)begin;
  do {
    if ((long)&end->o + lVar5 < 5) {
      return;
    }
    a = begin + 1;
    b = end;
    if (a < end) {
      do {
        uVar1 = *(ushort *)(width + 0x108);
        comparator.key = (FieldDef *)(ulong)uVar1;
        uVar10 = (ulong)begin->o;
        puVar11 = (ushort *)((long)begin + (uVar10 - (long)*(int *)((long)&begin->o + uVar10)));
        if ((uVar1 < *puVar11) &&
           (uVar2 = *(ushort *)((long)puVar11 + (long)comparator.key), uVar2 != 0)) {
          puVar9 = (uint *)((long)&begin->o + uVar2 + uVar10);
        }
        else {
          puVar9 = (uint *)0x0;
        }
        piVar12 = (int *)((long)&a->o + (ulong)a->o);
        if (uVar1 < *(ushort *)((long)piVar12 - (long)*piVar12)) {
          uVar1 = *(ushort *)(((long)piVar12 - (long)*piVar12) + (long)comparator.key);
          comparator.key = (FieldDef *)(ulong)uVar1;
          if (uVar1 == 0) goto LAB_00113a07;
          if (puVar9 != (uint *)0x0) {
            uVar3 = *(uint *)((long)puVar9 + (ulong)*puVar9);
            puVar13 = (uint *)((ulong)*(uint *)((long)piVar12 + (ulong)uVar1) +
                              (long)((long)piVar12 + (ulong)uVar1));
            uVar4 = *puVar13;
            uVar6 = uVar3;
            if (uVar4 < uVar3) {
              uVar6 = uVar4;
            }
            iVar8 = memcmp((uint *)((long)puVar9 + (ulong)*puVar9) + 1,puVar13 + 1,(ulong)uVar6);
            comparator.key = (FieldDef *)(ulong)(uVar3 < uVar4);
            bVar7 = iVar8 < 0;
            if (iVar8 == 0) {
              bVar7 = uVar3 < uVar4;
            }
            if (!bVar7) goto LAB_00113a01;
            goto LAB_00113a0c;
          }
LAB_00113a01:
          a = a + 1;
        }
        else {
LAB_00113a07:
          if (puVar9 == (uint *)0x0) goto LAB_00113a01;
LAB_00113a0c:
          b = b + -1;
          anon_unknown_0::SwapSerializedTables(a,b);
        }
      } while (a < b);
    }
    anon_unknown_0::SwapSerializedTables(begin,a + -1);
    SimpleQsort<flatbuffers::Offset<flatbuffers::Table>,flatbuffers::Parser::ParseVector(flatbuffers::Type_const&,unsigned_int*,flatbuffers::FieldDef*,unsigned_long)::__3,void(*)(flatbuffers::Offset<flatbuffers::Table>*,flatbuffers::Offset<flatbuffers::Table>*)>
              (begin,a + -1,width,comparator,swapper);
    lVar5 = -(long)b;
    begin = b;
  } while( true );
}

Assistant:

static void SimpleQsort(T *begin, T *end, size_t width, F comparator,
                        S swapper) {
  if (end - begin <= static_cast<ptrdiff_t>(width)) return;
  auto l = begin + width;
  auto r = end;
  while (l < r) {
    if (comparator(begin, l)) {
      r -= width;
      swapper(l, r);
    } else {
      l += width;
    }
  }
  l -= width;
  swapper(begin, l);
  SimpleQsort(begin, l, width, comparator, swapper);
  SimpleQsort(r, end, width, comparator, swapper);
}